

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemcmp(void *pB1,void *pB2,sxu32 nSize)

{
  sxu32 sVar1;
  byte *pbVar2;
  byte *pbVar3;
  int local_44;
  int local_40;
  sxu32 local_3c;
  byte *pbStack_38;
  sxu32 LEN;
  uchar *r2;
  uchar *r1;
  sxi32 rc;
  sxu32 nSize_local;
  void *pB2_local;
  void *pB1_local;
  
  if (nSize == 0) {
    pB1_local._4_4_ = 0;
  }
  else if ((pB1 == (void *)0x0) ||
          (local_3c = nSize, pbStack_38 = (byte *)pB2, r2 = (uchar *)pB1, pB2 == (void *)0x0)) {
    if (pB1 == (void *)0x0) {
      local_40 = -1;
      if (pB2 == (void *)0x0) {
        local_40 = 0;
      }
    }
    else {
      local_40 = 1;
    }
    pB1_local._4_4_ = local_40;
  }
  else {
    for (; (sVar1 = local_3c, pbVar3 = pbStack_38, pbVar2 = r2, local_3c != 0 &&
           (*r2 == *pbStack_38)); r2 = r2 + 4) {
      pbVar2 = r2 + 1;
      pbVar3 = pbStack_38 + 1;
      sVar1 = local_3c - 1;
      if ((sVar1 == 0) || (*pbVar2 != *pbVar3)) break;
      pbVar2 = r2 + 2;
      pbVar3 = pbStack_38 + 2;
      sVar1 = local_3c - 2;
      if ((sVar1 == 0) || (*pbVar2 != *pbVar3)) break;
      pbVar2 = r2 + 3;
      pbVar3 = pbStack_38 + 3;
      sVar1 = local_3c - 3;
      if ((sVar1 == 0) || (*pbVar2 != *pbVar3)) break;
      pbStack_38 = pbStack_38 + 4;
      local_3c = local_3c - 4;
    }
    r2 = pbVar2;
    pbStack_38 = pbVar3;
    local_3c = sVar1;
    if (local_3c == 0) {
      local_44 = 0;
    }
    else {
      local_44 = (uint)*r2 - (uint)*pbStack_38;
    }
    pB1_local._4_4_ = local_44;
  }
  return pB1_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyMemcmp(const void *pB1, const void *pB2, sxu32 nSize)
{
	sxi32 rc;
	if( nSize <= 0 ){
		return 0;
	}
	if( pB1 == 0 || pB2 == 0 ){
		return pB1 != 0 ? 1 : (pB2 == 0 ? 0 : -1);
	}
	SX_MACRO_FAST_CMP(pB1, pB2, nSize, rc);
	return rc;
}